

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O0

void __thiscall
amrex::MFIter::MFIter(MFIter *this,BoxArray *ba,DistributionMapping *dm,bool do_tiling_)

{
  undefined4 uVar1;
  int iVar2;
  BoxArray *pBVar3;
  type this_00;
  byte in_CL;
  FabArrayBase *in_RDI;
  unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
  *in_stack_ffffffffffffff70;
  IndexType *pIVar4;
  FabArrayBase *this_01;
  int *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  BoxArray *in_stack_ffffffffffffffa8;
  IntVect local_c;
  
  this_01 = in_RDI;
  std::
  make_unique<amrex::FabArrayBase,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int,int>
            (in_stack_ffffffffffffffa8,
             (DistributionMapping *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  pBVar3 = &this_01->boxarray;
  this_00 = std::unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>::
            operator*(in_stack_ffffffffffffff70);
  *(type *)&pBVar3->m_bat = this_00;
  pIVar4 = &(in_RDI->boxarray).m_bat.m_op.m_bndryReg.m_typ;
  if ((in_CL & 1) == 0) {
    IntVect::IntVect(&local_c,0);
    *(undefined8 *)pIVar4 = local_c.vect._0_8_;
    pIVar4[2] = (IndexType)local_c.vect[2];
  }
  else {
    uVar1 = FabArrayBase::mfiter_tile_size._4_4_;
    *(undefined4 *)((long)&(in_RDI->boxarray).m_bat.m_op + 4) =
         (undefined4)FabArrayBase::mfiter_tile_size;
    *(undefined4 *)((long)&(in_RDI->boxarray).m_bat.m_op + 8) = uVar1;
    (in_RDI->boxarray).m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] = DAT_01aa8260;
  }
  *(byte *)((long)&(in_RDI->boxarray).m_bat.m_op + 0x10) = in_CL & 1;
  iVar2 = Gpu::numGpuStreams();
  (in_RDI->boxarray).m_bat.m_op.m_bndryReg.m_hishft.vect[0] = iVar2;
  IndexType::IndexType((IndexType *)((in_RDI->boxarray).m_bat.m_op.m_bndryReg.m_hishft.vect + 1));
  *(undefined1 *)((long)&(in_RDI->boxarray).m_bat.m_op + 0x28) = 0;
  DeviceSync::DeviceSync
            ((DeviceSync *)((long)(in_RDI->boxarray).m_bat.m_op.m_bndryReg.m_hishft.vect + 9),true);
  *(undefined8 *)((long)&(in_RDI->boxarray).m_bat.m_op + 0x2c) = 0;
  *(undefined8 *)((long)&(in_RDI->boxarray).m_bat.m_op + 0x34) = 0;
  *(undefined8 *)((long)&(in_RDI->boxarray).m_bat.m_op + 0x3c) = 0;
  (in_RDI->boxarray).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (in_RDI->boxarray).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>::operator->
            ((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)0x12ce145
            );
  FabArrayBase::addThisBD(this_01);
  Initialize((MFIter *)this_00);
  return;
}

Assistant:

MFIter::MFIter (const BoxArray& ba, const DistributionMapping& dm, bool do_tiling_)
    :
    m_fa(std::make_unique<FabArrayBase>(ba,dm,1,0)),
    fabArray(*m_fa),
    tile_size((do_tiling_) ? FabArrayBase::mfiter_tile_size : IntVect::TheZeroVector()),
    flags(do_tiling_ ? Tiling : 0),
    streams(Gpu::numGpuStreams()),
    dynamic(false),
    device_sync(true),
    index_map(nullptr),
    local_index_map(nullptr),
    tile_array(nullptr),
    local_tile_index_map(nullptr),
    num_local_tiles(nullptr)
{
#ifdef AMREX_USE_OMP
#pragma omp single
#endif
    {
        m_fa->addThisBD();
    }
    Initialize();
}